

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlresult_p.h
# Opt level: O1

void __thiscall QSqlResultPrivate::~QSqlResultPrivate(QSqlResultPrivate *this)

{
  Data *pDVar1;
  Data *pDVar2;
  
  this->_vptr_QSqlResultPrivate = (_func_int **)&PTR__QSqlResultPrivate_0014f5e8;
  QArrayDataPointer<QHolder>::~QArrayDataPointer(&(this->holders).d);
  QHash<QString,_QList<int>_>::~QHash(&this->indexes);
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&(this->values).d);
  QHash<int,_QFlags<QSql::ParamTypeFlag>_>::~QHash(&this->types);
  pDVar1 = (this->executedQuery).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->executedQuery).d.d)->super_QArrayData,2,0x10);
    }
  }
  QSqlError::~QSqlError(&this->error);
  pDVar1 = (this->sql).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->sql).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->sqldriver).wp.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pDVar2->weakref)._q_value.super___atomic_base<int>._M_i == 0) &&
       (pDVar2 = (this->sqldriver).wp.d, pDVar2 != (Data *)0x0)) {
      operator_delete(pDVar2);
      return;
    }
  }
  return;
}

Assistant:

virtual ~QSqlResultPrivate() = default;